

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void bestOrClauseIndex(WhereBestIdx *p)

{
  int iCursor;
  int iVar1;
  int iVar2;
  WhereClause *pWVar3;
  SrcList_item *pSVar4;
  WhereOrInfo *pWVar5;
  WhereTerm *pWVar6;
  Expr **ppEVar7;
  u16 uVar8;
  Bitmask BVar9;
  long lVar10;
  WhereTerm *pWVar11;
  WhereBestIdx *pWVar12;
  WhereBestIdx *pWVar13;
  ulong uVar14;
  Index *pIVar15;
  byte bVar16;
  double dVar17;
  double dVar18;
  double N;
  WhereBestIdx local_2a0;
  Parse *local_228;
  WhereMaskSet *pWStack_220;
  WhereClause *local_218;
  undefined1 local_210;
  undefined2 local_20e;
  undefined4 local_20c;
  WhereTerm *local_200;
  
  bVar16 = 0;
  pWVar3 = p->pWC;
  pSVar4 = p->pSrc;
  iCursor = pSVar4->iCursor;
  BVar9 = getMask(pWVar3->pMaskSet,iCursor);
  if ((((pSVar4->field_0x39 & 1) == 0) && (pSVar4->pIndex == (Index *)0x0)) &&
     ((pWVar3->wctrlFlags & 0x80) == 0)) {
    pIVar15 = (Index *)pWVar3->a;
    iVar1 = pWVar3->nTerm;
    ppEVar7 = (Expr **)&pIVar15->zName;
    for (; pIVar15 < (Index *)(ppEVar7 + (long)iVar1 * 7); pIVar15 = (Index *)&pIVar15->aSortOrder)
    {
      if (((((ulong)pIVar15->pTable & 0x100) != 0) &&
          ((p->notReady & (ulong)pIVar15->pSchema & ~BVar9) == 0)) &&
         (pWVar5 = ((anon_union_8_3_737c4e49_for_u *)&pIVar15->aiRowEst)->pOrInfo,
         (pWVar5->indexable & BVar9) != 0)) {
        iVar2 = (pWVar5->wc).nTerm;
        pWVar6 = (pWVar5->wc).a;
        pWVar12 = p;
        pWVar13 = &local_2a0;
        for (lVar10 = 0xf; lVar10 != 0; lVar10 = lVar10 + -1) {
          pWVar13->pParse = pWVar12->pParse;
          pWVar12 = (WhereBestIdx *)((long)pWVar12 + (ulong)bVar16 * -0x10 + 8);
          pWVar13 = (WhereBestIdx *)((long)pWVar13 + ((ulong)bVar16 * -2 + 1) * 8);
        }
        local_2a0.pOrderBy = (ExprList *)0x0;
        local_2a0.pDistinct = (ExprList *)0x0;
        local_2a0.ppIdxInfo = (sqlite3_index_info **)0x0;
        dVar18 = 0.0;
        N = 0.0;
        uVar14 = 0;
        for (pWVar11 = (pWVar5->wc).a; pWVar11 < pWVar6 + iVar2; pWVar11 = pWVar11 + 1) {
          if ((pWVar11->eOperator & 0x200) == 0) {
            if (pWVar11->leftCursor == iCursor) {
              local_228 = pWVar3->pParse;
              pWStack_220 = pWVar3->pMaskSet;
              local_210 = 0x45;
              local_20e = 0;
              local_20c = 1;
              local_2a0.pWC = (WhereClause *)&local_228;
              local_218 = pWVar3;
              local_200 = pWVar11;
              goto LAB_0017bb37;
            }
          }
          else {
            local_2a0.pWC = *(WhereClause **)&pWVar11->u;
LAB_0017bb37:
            bestIndex(&local_2a0);
            dVar18 = dVar18 + local_2a0.cost.rCost;
            N = N + local_2a0.cost.plan.nRow;
            uVar14 = uVar14 | local_2a0.cost.used;
            if ((p->cost).rCost <= dVar18) break;
          }
        }
        if (p->pOrderBy != (ExprList *)0x0) {
          dVar17 = estLog(N);
          dVar18 = dVar18 + dVar17 * N;
        }
        if (dVar18 < (p->cost).rCost) {
          (p->cost).rCost = dVar18;
          (p->cost).used = uVar14;
          (p->cost).plan.nRow = N;
          if ((long)p->i == 0) {
            uVar8 = 0;
          }
          else {
            uVar8 = p->aLevel[(long)p->i + -1].plan.nOBSat;
          }
          (p->cost).plan.nOBSat = uVar8;
          (p->cost).plan.wsFlags = 0x10000000;
          (p->cost).plan.u.pIdx = pIVar15;
        }
      }
    }
  }
  return;
}

Assistant:

static void bestOrClauseIndex(WhereBestIdx *p){
#ifndef SQLITE_OMIT_OR_OPTIMIZATION
  WhereClause *pWC = p->pWC;           /* The WHERE clause */
  struct SrcList_item *pSrc = p->pSrc; /* The FROM clause term to search */
  const int iCur = pSrc->iCursor;      /* The cursor of the table  */
  const Bitmask maskSrc = getMask(pWC->pMaskSet, iCur);  /* Bitmask for pSrc */
  WhereTerm * const pWCEnd = &pWC->a[pWC->nTerm];        /* End of pWC->a[] */
  WhereTerm *pTerm;                    /* A single term of the WHERE clause */

  /* The OR-clause optimization is disallowed if the INDEXED BY or
  ** NOT INDEXED clauses are used or if the WHERE_AND_ONLY bit is set. */
  if( pSrc->notIndexed || pSrc->pIndex!=0 ){
    return;
  }
  if( pWC->wctrlFlags & WHERE_AND_ONLY ){
    return;
  }

  /* Search the WHERE clause terms for a usable WO_OR term. */
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    if( (pTerm->eOperator & WO_OR)!=0
     && ((pTerm->prereqAll & ~maskSrc) & p->notReady)==0
     && (pTerm->u.pOrInfo->indexable & maskSrc)!=0 
    ){
      WhereClause * const pOrWC = &pTerm->u.pOrInfo->wc;
      WhereTerm * const pOrWCEnd = &pOrWC->a[pOrWC->nTerm];
      WhereTerm *pOrTerm;
      int flags = WHERE_MULTI_OR;
      double rTotal = 0;
      double nRow = 0;
      Bitmask used = 0;
      WhereBestIdx sBOI;

      sBOI = *p;
      sBOI.pOrderBy = 0;
      sBOI.pDistinct = 0;
      sBOI.ppIdxInfo = 0;
      for(pOrTerm=pOrWC->a; pOrTerm<pOrWCEnd; pOrTerm++){
        WHERETRACE(("... Multi-index OR testing for term %d of %d....\n", 
          (pOrTerm - pOrWC->a), (pTerm - pWC->a)
        ));
        if( (pOrTerm->eOperator& WO_AND)!=0 ){
          sBOI.pWC = &pOrTerm->u.pAndInfo->wc;
          bestIndex(&sBOI);
        }else if( pOrTerm->leftCursor==iCur ){
          WhereClause tempWC;
          tempWC.pParse = pWC->pParse;
          tempWC.pMaskSet = pWC->pMaskSet;
          tempWC.pOuter = pWC;
          tempWC.op = TK_AND;
          tempWC.a = pOrTerm;
          tempWC.wctrlFlags = 0;
          tempWC.nTerm = 1;
          sBOI.pWC = &tempWC;
          bestIndex(&sBOI);
        }else{
          continue;
        }
        rTotal += sBOI.cost.rCost;
        nRow += sBOI.cost.plan.nRow;
        used |= sBOI.cost.used;
        if( rTotal>=p->cost.rCost ) break;
      }

      /* If there is an ORDER BY clause, increase the scan cost to account 
      ** for the cost of the sort. */
      if( p->pOrderBy!=0 ){
        WHERETRACE(("... sorting increases OR cost %.9g to %.9g\n",
                    rTotal, rTotal+nRow*estLog(nRow)));
        rTotal += nRow*estLog(nRow);
      }

      /* If the cost of scanning using this OR term for optimization is
      ** less than the current cost stored in pCost, replace the contents
      ** of pCost. */
      WHERETRACE(("... multi-index OR cost=%.9g nrow=%.9g\n", rTotal, nRow));
      if( rTotal<p->cost.rCost ){
        p->cost.rCost = rTotal;
        p->cost.used = used;
        p->cost.plan.nRow = nRow;
        p->cost.plan.nOBSat = p->i ? p->aLevel[p->i-1].plan.nOBSat : 0;
        p->cost.plan.wsFlags = flags;
        p->cost.plan.u.pTerm = pTerm;
      }
    }
  }
#endif /* SQLITE_OMIT_OR_OPTIMIZATION */
}